

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O3

Item * __thiscall World::add_item(World *this,Item *item)

{
  _Rb_tree_header *p_Var1;
  undefined1 uVar2;
  mapped_type *ppIVar3;
  LandstalkerException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  _Base_ptr p_Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  _Base_ptr p_Var7;
  bool bVar8;
  uint8_t local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  uVar2 = item->_id;
  p_Var5 = (this->_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var1 = &(this->_items)._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = &p_Var1->_M_header;
    do {
      bVar8 = (byte)(char)p_Var5[1]._M_color < (byte)uVar2;
      if (!bVar8) {
        p_Var7 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[bVar8];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var7 != p_Var1) && ((byte)(char)p_Var7[1]._M_color <= (byte)uVar2)) {
      this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
      std::__cxx11::to_string(&local_88,(uint)item->_id);
      std::operator+(&local_68,"Cannot add item #",&local_88);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_68," since there is already one with the same ID (");
      local_c8._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar6 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p == paVar6) {
        local_c8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_c8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      }
      else {
        local_c8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_c8._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      local_c9 = item->_id;
      ppIVar3 = std::
                map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                ::operator[](&this->_items,&local_c9);
      std::operator+(&local_48,&local_c8,&(*ppIVar3)->_name);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_48,")");
      local_a8._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar6 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p == paVar6) {
        local_a8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      }
      else {
        local_a8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_a8._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      LandstalkerException::LandstalkerException(this_00,&local_a8);
      __cxa_throw(this_00,&LandstalkerException::typeinfo,
                  LandstalkerException::~LandstalkerException);
    }
  }
  local_a8._M_dataplus._M_p._0_1_ = uVar2;
  ppIVar3 = std::
            map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
            ::operator[](&this->_items,(key_type_conflict *)&local_a8);
  *ppIVar3 = item;
  return item;
}

Assistant:

Item* World::add_item(Item* item)
{
    if(_items.count(item->id()))
        throw LandstalkerException("Cannot add item #" + std::to_string(item->id()) + " since there is already one with the same ID (" + _items[item->id()]->name() + ")");

    _items[item->id()] = item;
    return item;
}